

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O0

TSpellCorrector * __thiscall
NJamSpell::TSpellCorrector::FixFragment(TSpellCorrector *this,wstring *text)

{
  wchar_t orig_00;
  wchar_t *pwVar1;
  ulong uVar2;
  pointer pTVar3;
  bool bVar4;
  pointer pTVar5;
  reference pvVar6;
  size_type sVar7;
  const_reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  long lVar11;
  ulong uVar12;
  wchar_t *pwVar13;
  ulong uVar14;
  wstring *in_RDX;
  wchar_t wVar15;
  wchar_t origChar;
  wchar_t newChar;
  size_t n;
  size_t k;
  wstring local_178 [8];
  wstring origLowered;
  allocator local_151;
  wstring local_150 [8];
  wstring origWord;
  allocator local_129;
  wstring local_128 [8];
  wstring newWord;
  size_t currOrigPos;
  TWords candidates;
  TWord lowered_1;
  TWord orig;
  ulong local_c0;
  size_t j;
  TWords *origWords;
  TWords words;
  size_t i;
  size_t origPos;
  undefined1 local_80 [8];
  TSentences sentences;
  wstring local_58 [8];
  wstring lowered;
  undefined1 local_38 [8];
  TSentences origSentences;
  wstring *text_local;
  TSpellCorrector *this_local;
  wstring *result;
  
  origSentences.
  super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_RDX;
  TLangModel::Tokenize((TSentences *)local_38,(TLangModel *)text,in_RDX);
  std::__cxx11::wstring::wstring
            (local_58,(wstring *)
                      origSentences.
                      super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ToLower((wstring *)local_58);
  TLangModel::Tokenize((TSentences *)local_80,(TLangModel *)text,(wstring *)local_58);
  std::__cxx11::wstring::wstring((wstring *)this);
  i = 0;
  words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    pTVar3 = words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pTVar5 = (pointer)std::
                      vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                      ::size((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                              *)local_80);
    wVar15 = (wchar_t)this;
    if (pTVar5 <= pTVar3) break;
    pvVar6 = std::
             vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
             ::operator[]((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                           *)local_80,
                          (size_type)
                          words.
                          super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::vector
              ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&origWords,pvVar6);
    pvVar6 = std::
             vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
             ::operator[]((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                           *)local_38,
                          (size_type)
                          words.
                          super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    for (local_c0 = 0;
        sVar7 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::size
                          ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&origWords
                          ), local_c0 < sVar7; local_c0 = local_c0 + 1) {
      pvVar8 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::operator[]
                         (pvVar6,local_c0);
      pwVar13 = pvVar8->Ptr;
      uVar14 = pvVar8->Len;
      pvVar9 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::operator[]
                         ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&origWords,
                          local_c0);
      candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pvVar9->Ptr;
      uVar12 = pvVar9->Len;
      GetCandidatesRaw((TWords *)&currOrigPos,(TSpellCorrector *)text,
                       (vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&origWords,
                       local_c0);
      sVar7 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::size
                        ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&currOrigPos
                        );
      if (sVar7 != 0) {
        pvVar9 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::operator[]
                           ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)
                            &currOrigPos,0);
        pvVar10 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::operator[]
                            ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)
                             &origWords,local_c0);
        pvVar10->Ptr = pvVar9->Ptr;
        pvVar10->Len = pvVar9->Len;
      }
      lVar11 = std::__cxx11::wstring::operator[]
                         ((ulong)origSentences.
                                 super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      for (; i < (ulong)((long)pwVar13 - lVar11 >> 2); i = i + 1) {
        std::__cxx11::wstring::operator[]
                  ((ulong)origSentences.
                          super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::wstring::push_back(wVar15);
      }
      pvVar9 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::operator[]
                         ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&origWords,
                          local_c0);
      pwVar1 = pvVar9->Ptr;
      pvVar9 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::operator[]
                         ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&origWords,
                          local_c0);
      uVar2 = pvVar9->Len;
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring(local_128,pwVar1,uVar2,&local_129);
      std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_129);
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring(local_150,pwVar13,uVar14,&local_151);
      std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_151);
      pTVar3 = candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring(local_178,(wchar_t *)pTVar3,uVar12,(allocator *)((long)&k + 7))
      ;
      std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)((long)&k + 7));
      bVar4 = std::operator!=((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)local_128,
                              (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)local_178);
      if (bVar4) {
        for (n = 0; uVar12 = std::__cxx11::wstring::size(), n < uVar12; n = n + 1) {
          uVar12 = std::__cxx11::wstring::size();
          if (uVar12 <= n) {
            std::__cxx11::wstring::size();
          }
          pwVar13 = (wchar_t *)std::__cxx11::wstring::operator[]((ulong)local_128);
          orig_00 = *pwVar13;
          pwVar13 = (wchar_t *)std::__cxx11::wstring::operator[]((ulong)local_150);
          MakeUpperIfRequired(orig_00,*pwVar13);
          std::__cxx11::wstring::push_back(wVar15);
        }
      }
      else {
        std::__cxx11::wstring::operator+=((wstring *)this,local_150);
      }
      i = uVar14 + i;
      std::__cxx11::wstring::~wstring(local_178);
      std::__cxx11::wstring::~wstring(local_150);
      std::__cxx11::wstring::~wstring(local_128);
      std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~vector
                ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&currOrigPos);
    }
    std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~vector
              ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&origWords);
    words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&(words.
                           super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage)->Ptr + 1);
  }
  for (; uVar14 = std::__cxx11::wstring::size(), i < uVar14; i = i + 1) {
    std::__cxx11::wstring::operator[]
              ((ulong)origSentences.
                      super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::wstring::push_back(wVar15);
  }
  std::
  vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
  ::~vector((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
             *)local_80);
  std::__cxx11::wstring::~wstring(local_58);
  std::
  vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
  ::~vector((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
             *)local_38);
  return this;
}

Assistant:

std::wstring TSpellCorrector::FixFragment(const std::wstring& text) const {
    TSentences origSentences = LangModel.Tokenize(text);
    std::wstring lowered = text;
    ToLower(lowered);
    TSentences sentences = LangModel.Tokenize(lowered);
    std::wstring result;
    size_t origPos = 0;
    for (size_t i = 0; i < sentences.size(); ++i) {
        TWords words = sentences[i];
        const TWords& origWords = origSentences[i];
        for (size_t j = 0; j < words.size(); ++j) {
            TWord orig = origWords[j];
            TWord lowered = words[j];
            TWords candidates = GetCandidatesRaw(words, j);
            if (candidates.size() > 0) {
                words[j] = candidates[0];
            }
            size_t currOrigPos = orig.Ptr - &text[0];
            while (origPos < currOrigPos) {
                result.push_back(text[origPos]);
                origPos += 1;
            }
            std::wstring newWord = std::wstring(words[j].Ptr, words[j].Len);
            std::wstring origWord = std::wstring(orig.Ptr, orig.Len);
            std::wstring origLowered = std::wstring(lowered.Ptr, lowered.Len);
            if (newWord != origLowered) {
                for (size_t k = 0; k < newWord.size(); ++k) {
                    size_t n = k < origWord.size() ? k : origWord.size() - 1;
                    wchar_t newChar = newWord[k];
                    wchar_t origChar = origWord[n];
                    result.push_back(MakeUpperIfRequired(newChar, origChar));
                }
            } else {
                result += origWord;
            }
            origPos += orig.Len;
        }
    }
    while (origPos < text.size()) {
        result.push_back(text[origPos]);
        origPos += 1;
    }
    return result;
}